

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMParser.cpp
# Opt level: O3

bool __thiscall
cmm::CMMParser::parseStatement
          (CMMParser *this,
          unique_ptr<cmm::StatementAST,_std::default_delete<cmm::StatementAST>_> *Res)

{
  bool bVar1;
  string local_30;
  
  switch((this->Lexer).CurTok.Kind) {
  case Identifier:
  case String:
  case Integer:
  case Double:
  case Boolean:
  case LParen:
  case Plus:
  case Minus:
  case Exclaim:
  case Tilde:
    bVar1 = parseExprStatement(this,Res);
    return bVar1;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"unexpected token in statement","");
    bVar1 = CMMLexer::Error(&this->Lexer,(this->Lexer).TokStartLoc,&local_30);
    break;
  case LCurly:
    bVar1 = parseBlock(this,Res);
    return bVar1;
  case Semicolon:
    parseEmptyStatement(this,Res);
    return false;
  case Kw_if:
    bVar1 = parseIfStatement(this,Res);
    return bVar1;
  case Kw_for:
    bVar1 = parseForStatement(this,Res);
    return bVar1;
  case Kw_while:
    bVar1 = parseWhileStatement(this,Res);
    return bVar1;
  case Kw_break:
    bVar1 = parseBreakStatement(this,Res);
    return bVar1;
  case Kw_continue:
    bVar1 = parseContinueStatement(this,Res);
    return bVar1;
  case Kw_return:
    bVar1 = parseReturnStatement(this,Res);
    return bVar1;
  case Kw_string:
  case Kw_int:
  case Kw_double:
  case Kw_bool:
    bVar1 = parseDeclarationStatement(this,Res);
    return bVar1;
  case Kw_void:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"`void\' only appears before function definition","");
    bVar1 = CMMLexer::Error(&this->Lexer,(this->Lexer).TokStartLoc,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool CMMParser::parseStatement(std::unique_ptr<StatementAST> &Res) {
  switch (getKind()) {
  default:
    return Error("unexpected token in statement");
  case Token::LCurly:       return parseBlock(Res);
  case Token::Kw_if:        return parseIfStatement(Res);
  case Token::Kw_while:     return parseWhileStatement(Res);
  case Token::Kw_for:       return parseForStatement(Res);
  case Token::Kw_return:    return parseReturnStatement(Res);
  case Token::Kw_break:     return parseBreakStatement(Res);
  case Token::Kw_continue:  return parseContinueStatement(Res);
  case Token::Semicolon:    return parseEmptyStatement(Res);
  case Token::Kw_bool:
  case Token::Kw_int:
  case Token::Kw_double:
  case Token::Kw_string:
    return parseDeclarationStatement(Res);
  case Token::Kw_void:
    return Error("`void' only appears before function definition");
  case Token::LParen:   case Token::Identifier:
  case Token::Double:   case Token::String:
  case Token::Boolean:  case Token::Integer:
  case Token::Plus:     case Token::Minus:
  case Token::Tilde:    case Token::Exclaim:
    return parseExprStatement(Res);
  }
}